

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_drop_modules(sqlite3 *db,char **azNames)

{
  HashElem *pHVar1;
  void *pvVar2;
  int iVar3;
  HashElem *pHVar4;
  char **ppcVar5;
  
  pHVar4 = (db->aModule).first;
  do {
    while( true ) {
      if (pHVar4 == (HashElem *)0x0) {
        return 0;
      }
      pHVar1 = pHVar4->next;
      pvVar2 = pHVar4->data;
      ppcVar5 = azNames;
      pHVar4 = pHVar1;
      if (azNames != (char **)0x0) break;
LAB_0011e6a3:
      createModule(db,*(char **)((long)pvVar2 + 8),(sqlite3_module *)0x0,(void *)0x0,
                   (_func_void_void_ptr *)0x0);
    }
    do {
      if (*ppcVar5 == (char *)0x0) goto LAB_0011e6a3;
      iVar3 = strcmp(*ppcVar5,*(char **)((long)pvVar2 + 8));
      ppcVar5 = ppcVar5 + 1;
    } while (iVar3 != 0);
  } while( true );
}

Assistant:

SQLITE_API int sqlite3_drop_modules(sqlite3 *db, const char** azNames){
  HashElem *pThis, *pNext;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  for(pThis=sqliteHashFirst(&db->aModule); pThis; pThis=pNext){
    Module *pMod = (Module*)sqliteHashData(pThis);
    pNext = sqliteHashNext(pThis);
    if( azNames ){
      int ii;
      for(ii=0; azNames[ii]!=0 && strcmp(azNames[ii],pMod->zName)!=0; ii++){}
      if( azNames[ii]!=0 ) continue;
    }
    createModule(db, pMod->zName, 0, 0, 0);
  }
  return SQLITE_OK;
}